

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ACES_Sequence_Parser.cpp
# Opt level: O0

SequenceParser * __thiscall
AS_02::ACES::SequenceParser::OpenRead
          (SequenceParser *this,
          list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *file_list,bool pedantic,
          list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *target_frame_file_list)

{
  int iVar1;
  h__SequenceParser *phVar2;
  size_type sVar3;
  undefined7 in_register_00000011;
  _List_node_base **this_00;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_R8;
  undefined1 local_a8 [128];
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *target_frame_file_list_local;
  v2f vStack_20;
  bool pedantic_local;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *file_list_local;
  SequenceParser *this_local;
  Result_t *result;
  
  vStack_20._1_7_ = in_register_00000011;
  vStack_20.x._0_1_ = pedantic;
  target_frame_file_list_local._7_1_ = (byte)target_frame_file_list & 1;
  local_a8._120_8_ = in_R8;
  file_list_local = file_list;
  this_local = this;
  phVar2 = (h__SequenceParser *)operator_new(0x120);
  h__SequenceParser::h__SequenceParser(phVar2);
  this_00 = &(file_list->
             super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl._M_node.super__List_node_base._M_prev;
  ASDCP::mem_ptr<AS_02::ACES::SequenceParser::h__SequenceParser>::operator=
            ((mem_ptr<AS_02::ACES::SequenceParser::h__SequenceParser> *)this_00,phVar2);
  local_a8[0x6b] = 0;
  phVar2 = ASDCP::mem_ptr<AS_02::ACES::SequenceParser::h__SequenceParser>::operator->
                     ((mem_ptr<AS_02::ACES::SequenceParser::h__SequenceParser> *)this_00);
  h__SequenceParser::OpenRead
            ((h__SequenceParser *)this,
             (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)phVar2,vStack_20.x._0_1_);
  iVar1 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  if ((-1 < iVar1) &&
     (sVar3 = std::__cxx11::
              list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_a8._120_8_), sVar3 != 0)) {
    phVar2 = ASDCP::mem_ptr<AS_02::ACES::SequenceParser::h__SequenceParser>::operator->
                       ((mem_ptr<AS_02::ACES::SequenceParser::h__SequenceParser> *)
                        &(file_list->
                         super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl._M_node.super__List_node_base._M_prev);
    h__SequenceParser::OpenTargetFrameSequenceRead
              ((h__SequenceParser *)local_a8,
               (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)phVar2);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)local_a8);
    Kumu::Result_t::~Result_t((Result_t *)local_a8);
  }
  iVar1 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  if (iVar1 < 0) {
    ASDCP::mem_ptr<AS_02::ACES::SequenceParser::h__SequenceParser>::release
              ((mem_ptr<AS_02::ACES::SequenceParser::h__SequenceParser> *)
               &(file_list->
                super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl._M_node.super__List_node_base._M_prev);
  }
  return this;
}

Assistant:

AS_02::Result_t AS_02::ACES::SequenceParser::OpenRead(const std::list<std::string> &file_list, bool pedantic /*= false*/, const std::list<std::string> &target_frame_file_list /* = std::list<std::string>()*/) const
{

  const_cast<AS_02::ACES::SequenceParser*>(this)->m_Parser = new h__SequenceParser;

  Result_t result = m_Parser->OpenRead(file_list, pedantic);

  if(ASDCP_SUCCESS(result))
    if (target_frame_file_list.size() > 0 ) result = m_Parser->OpenTargetFrameSequenceRead(target_frame_file_list);

  if(ASDCP_FAILURE(result))
    const_cast<AS_02::ACES::SequenceParser*>(this)->m_Parser.release();

  return result;
}